

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.h
# Opt level: O3

void __thiscall
Js::DataView::SetValue<unsigned_short,unsigned_short*>
          (DataView *this,Var offset,unsigned_short value,BOOL isLittleEndian,char16 *funcName)

{
  uint uVar1;
  ScriptContext *scriptContext;
  uint32 uVar2;
  ushort uVar3;
  
  scriptContext =
       (((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
           super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  uVar1 = (this->super_ArrayBufferParent).super_ArrayObject.length;
  if (uVar1 < 2) {
    JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec1f,funcName);
  }
  uVar2 = ArrayBuffer::ToIndex(offset,-0x7ff5ec1f,scriptContext,uVar1 - 2,false);
  if (((this->super_ArrayBufferParent).arrayBuffer.ptr)->isDetached != true) {
    uVar3 = value << 8 | value >> 8;
    if (isLittleEndian != 0) {
      uVar3 = value;
    }
    *(ushort *)((this->buffer).ptr + uVar2) = uVar3;
    return;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ebe5,funcName);
}

Assistant:

void SetValue(Var offset, TypeName value, BOOL isLittleEndian, const char16 *funcName)
        {
            ScriptContext* scriptContext = GetScriptContext();

            uint32 length = GetLength();
            if (length < sizeof(TypeName))
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_DataView_InvalidOffset, funcName);
            }

            uint32 byteOffset = ArrayBuffer::ToIndex(offset, JSERR_DataView_InvalidOffset, scriptContext, length - sizeof(TypeName), false);
            if (this->GetArrayBuffer()->IsDetached())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, funcName);
            }

            TypeName* typedBuffer = (TypeName*)(buffer + byteOffset);
            if (!isLittleEndian)
            {
                SwapRoutine<TypeName>(&value, typedBuffer);
            }
            else
            {
                *static_cast<PointerAccessTypeName>(typedBuffer) = value;
            }
        }